

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

void __thiscall
cmGeneratedFileStream::cmGeneratedFileStream(cmGeneratedFileStream *this,char *name,bool quiet)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *m2;
  bool quiet_local;
  char *name_local;
  cmGeneratedFileStream *this_local;
  
  std::ios::ios((ios *)&(this->super_ofstream).field_0x140);
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8,
             name);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__cmGeneratedFileStream_00c405a8;
  *(undefined ***)&(this->super_ofstream).field_0x140 = &PTR__cmGeneratedFileStream_00c405d0;
  _Var2 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(this,(char *)&PTR_construction_vtable_24__00c405e8,_Var2);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__cmGeneratedFileStream_00c405a8;
  *(undefined ***)&(this->super_ofstream).field_0x140 = &PTR__cmGeneratedFileStream_00c405d0;
  bVar1 = std::ios::operator!((ios *)((long)&(this->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream +
                                     (long)(this->super_ofstream).
                                           super_basic_ostream<char,_std::char_traits<char>_>.
                                           _vptr_basic_ostream[-3]));
  if (((bVar1 & 1) != 0) && (!quiet)) {
    m2 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error("Cannot open file for write: ",m2,(char *)0x0,(char *)0x0);
    cmSystemTools::ReportLastSystemError("");
  }
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream(const char* name, bool quiet):
  cmGeneratedFileStreamBase(name),
  Stream(TempName.c_str())
{
  // Check if the file opened.
  if(!*this && !quiet)
    {
    cmSystemTools::Error("Cannot open file for write: ",
                         this->TempName.c_str());
    cmSystemTools::ReportLastSystemError("");
    }
}